

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.h
# Opt level: O2

int set_rdmult(AV1_COMP *cpi,MACROBLOCK *x,int segment_id)

{
  FRAME_UPDATE_TYPE update_type;
  FRAME_TYPE frame_type;
  aom_bit_depth_t bit_depth;
  int iVar1;
  aom_enc_pass aVar2;
  AV1_PRIMARY *pAVar3;
  int qindex;
  int iVar4;
  int layer_depth;
  uint is_stat_consumption_stage;
  
  pAVar3 = cpi->ppi;
  bit_depth = ((cpi->common).seq_params)->bit_depth;
  update_type = (pAVar3->gf_group).update_type[cpi->gf_frame_index];
  frame_type = (cpi->common).current_frame.frame_type;
  iVar4 = (pAVar3->p_rc).gfu_boost;
  iVar1 = (pAVar3->gf_group).layer_depth[cpi->gf_frame_index];
  qindex = av1_get_qindex(&(cpi->common).seg,(int)x,(cpi->common).quant_params.base_qindex);
  aVar2 = (cpi->oxcf).pass;
  if (aVar2 < AOM_RC_LAST_PASS) {
    is_stat_consumption_stage = 0;
    if ((aVar2 == AOM_RC_ONE_PASS) && (cpi->compressor_stage == '\0')) {
      is_stat_consumption_stage = (uint)(cpi->ppi->lap_enabled != 0);
    }
  }
  else {
    is_stat_consumption_stage = 1;
  }
  layer_depth = 6;
  if (iVar1 < 6) {
    layer_depth = iVar1;
  }
  iVar1 = 0xf;
  if (iVar4 < 0x640) {
    iVar1 = iVar4 / 100;
  }
  iVar4 = av1_compute_rd_mult(qindex,bit_depth,update_type,layer_depth,iVar1,frame_type,
                              (cpi->oxcf).q_cfg.use_fixed_qp_offsets,is_stat_consumption_stage,
                              (cpi->oxcf).tune_cfg.tuning);
  return iVar4;
}

Assistant:

static inline int set_rdmult(const AV1_COMP *const cpi,
                             const MACROBLOCK *const x, int segment_id) {
  const AV1_COMMON *const cm = &cpi->common;
  const GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  const CommonQuantParams *quant_params = &cm->quant_params;
  const aom_bit_depth_t bit_depth = cm->seq_params->bit_depth;
  const FRAME_UPDATE_TYPE update_type =
      cpi->ppi->gf_group.update_type[cpi->gf_frame_index];
  const FRAME_TYPE frame_type = cm->current_frame.frame_type;
  const int boost_index = AOMMIN(15, (cpi->ppi->p_rc.gfu_boost / 100));
  const int layer_depth = AOMMIN(gf_group->layer_depth[cpi->gf_frame_index], 6);

  int qindex;
  if (segment_id >= 0) {
    qindex = av1_get_qindex(&cm->seg, segment_id, cm->quant_params.base_qindex);
  } else {
    qindex = quant_params->base_qindex + x->rdmult_delta_qindex +
             quant_params->y_dc_delta_q;
  }

  return av1_compute_rd_mult(
      qindex, bit_depth, update_type, layer_depth, boost_index, frame_type,
      cpi->oxcf.q_cfg.use_fixed_qp_offsets, is_stat_consumption_stage(cpi),
      cpi->oxcf.tune_cfg.tuning);
}